

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx.cpp
# Opt level: O2

int __thiscall
ncnn::LRN_x86_avx::forward_inplace(LRN_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint _w;
  uint _h;
  size_t _elemsize;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  int *piVar7;
  void *pvVar8;
  void *pvVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  long lVar13;
  _func_int **pp_Var14;
  undefined1 (*pauVar15) [32];
  ulong uVar16;
  int k;
  int iVar17;
  int iVar18;
  float *pfVar19;
  _func_int *p_Var20;
  ulong uVar21;
  uint uVar22;
  int iVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  int iVar27;
  uint uVar28;
  int j;
  ulong uVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar35;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  Mat square_sum;
  Mat square_blob;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  Option opt_b;
  vector<int,_std::allocator<int>_> _space_ofs;
  
  _w = bottom_top_blob->w;
  _h = bottom_top_blob->h;
  iVar18 = bottom_top_blob->c;
  _elemsize = bottom_top_blob->elemsize;
  square_blob.cstep = 0;
  square_blob.data = (Allocator *)0x0;
  square_blob.refcount._0_4_ = 0;
  square_blob.refcount._4_4_ = 0;
  square_blob.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  square_blob.elempack = 0;
  square_blob.allocator = (Allocator *)square_blob.data;
  square_blob.dims = (int)square_blob.refcount;
  square_blob.w = square_blob.refcount._4_4_;
  square_blob._48_8_ = square_blob.elemsize;
  square_blob.c = square_blob.elempack;
  Mat::create(&square_blob,_w,_h,iVar18,_elemsize,opt->workspace_allocator);
  iVar23 = -100;
  if ((square_blob.data == (void *)0x0) || ((long)square_blob.c * square_blob.cstep == 0))
  goto LAB_001d3fd8;
  iVar23 = _h * _w;
  iVar27 = 0;
  iVar12 = 0;
  if (0 < iVar18) {
    iVar12 = iVar18;
  }
  for (; iVar27 != iVar12; iVar27 = iVar27 + 1) {
    Mat::channel(&square_sum,bottom_top_blob,iVar27);
    pvVar8 = square_sum.data;
    Mat::~Mat(&square_sum);
    Mat::channel(&square_sum,&square_blob,iVar27);
    pvVar9 = square_sum.data;
    Mat::~Mat(&square_sum);
    lVar13 = 0;
    pauVar15 = (undefined1 (*) [32])pvVar9;
    pfVar19 = (float *)pvVar8;
    for (iVar17 = 0; iVar17 + 7 < iVar23; iVar17 = iVar17 + 8) {
      auVar2._4_4_ = pfVar19[1] * pfVar19[1];
      auVar2._0_4_ = *pfVar19 * *pfVar19;
      auVar2._8_4_ = pfVar19[2] * pfVar19[2];
      auVar2._12_4_ = pfVar19[3] * pfVar19[3];
      auVar2._16_4_ = pfVar19[4] * pfVar19[4];
      auVar2._20_4_ = pfVar19[5] * pfVar19[5];
      auVar2._24_4_ = pfVar19[6] * pfVar19[6];
      auVar2._28_4_ = pfVar19[7];
      *pauVar15 = auVar2;
      pfVar19 = pfVar19 + 8;
      pauVar15 = pauVar15 + 1;
      lVar13 = lVar13 + 8;
    }
    for (; (int)lVar13 < iVar23; lVar13 = lVar13 + 1) {
      fVar31 = *(float *)((long)pvVar8 + lVar13 * 4);
      *(float *)((long)pvVar9 + lVar13 * 4) = fVar31 * fVar31;
    }
  }
  pp_Var14 = this->_vptr_LRN_x86_avx;
  if (*(int *)(&this->field_0xd0 + (long)pp_Var14[-3]) == 0) {
    square_sum.cstep = 0;
    square_sum.data = (void *)0x0;
    square_sum.refcount._0_4_ = 0;
    square_sum.refcount._4_4_ = 0;
    square_sum.elemsize._0_4_ = 0;
    square_sum.elemsize._4_4_ = 0;
    square_sum.elempack = 0;
    square_sum.allocator = (Allocator *)0x0;
    square_sum.dims = 0;
    square_sum.w = 0;
    square_sum.h = 0;
    square_sum.d = 0;
    square_sum.c = 0;
    Mat::create(&square_sum,_w,_h,iVar18,_elemsize,opt->workspace_allocator);
    if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0)) {
LAB_001d3fcb:
      Mat::~Mat(&square_sum);
      iVar23 = -100;
      goto LAB_001d3fd8;
    }
    Mat::fill(&square_sum,0.0);
    fVar31 = *(float *)(&this->field_0xd8 + (long)this->_vptr_LRN_x86_avx[-3]) /
             (float)*(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
    auVar5 = vshufps_avx(ZEXT416((uint)fVar31),ZEXT416((uint)fVar31),0);
    for (iVar27 = 0; iVar27 != iVar12; iVar27 = iVar27 + 1) {
      iVar17 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
      for (iVar30 = iVar17 / -2 + iVar27; iVar30 <= iVar17 / 2 + iVar27; iVar30 = iVar30 + 1) {
        if (iVar30 < iVar18 && -1 < iVar30) {
          Mat::channel((Mat *)&opt_b,&square_blob,iVar30);
          uVar10 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          Mat::channel((Mat *)&opt_b,&square_sum,iVar27);
          uVar11 = opt_b._0_8_;
          Mat::~Mat((Mat *)&opt_b);
          lVar13 = 0;
          pauVar15 = (undefined1 (*) [32])uVar11;
          pfVar19 = (float *)uVar10;
          for (iVar17 = 0; iVar17 + 7 < iVar23; iVar17 = iVar17 + 8) {
            auVar33._0_4_ = *(float *)*pauVar15 + *pfVar19;
            auVar33._4_4_ = *(float *)(*pauVar15 + 4) + pfVar19[1];
            auVar33._8_4_ = *(float *)(*pauVar15 + 8) + pfVar19[2];
            auVar33._12_4_ = *(float *)(*pauVar15 + 0xc) + pfVar19[3];
            auVar33._16_4_ = *(float *)(*pauVar15 + 0x10) + pfVar19[4];
            auVar33._20_4_ = *(float *)(*pauVar15 + 0x14) + pfVar19[5];
            auVar33._24_4_ = *(float *)(*pauVar15 + 0x18) + pfVar19[6];
            auVar33._28_4_ = *(float *)(*pauVar15 + 0x1c) + pfVar19[7];
            *pauVar15 = auVar33;
            pfVar19 = pfVar19 + 8;
            pauVar15 = pauVar15 + 1;
            lVar13 = lVar13 + 8;
          }
          for (; (int)lVar13 < iVar23; lVar13 = lVar13 + 1) {
            *(float *)(uVar11 + lVar13 * 4) =
                 *(float *)(uVar11 + lVar13 * 4) + *(float *)(uVar10 + lVar13 * 4);
          }
          iVar17 = *(int *)(&this->field_0xd4 + (long)this->_vptr_LRN_x86_avx[-3]);
        }
      }
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar27);
      uVar10 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar27);
      uVar11 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      pp_Var14 = this->_vptr_LRN_x86_avx;
      p_Var20 = pp_Var14[-3];
      fVar32 = *(float *)(&this->field_0xe0 + (long)p_Var20);
      fVar1 = *(float *)(&this->field_0xdc + (long)p_Var20);
      uVar25 = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
      lVar13 = 0;
      pauVar15 = (undefined1 (*) [32])uVar10;
      pfVar19 = (float *)uVar11;
      for (iVar17 = 0; iVar17 + 7 < iVar23; iVar17 = iVar17 + 8) {
        local_b8 = auVar5._0_4_;
        fStack_b4 = auVar5._4_4_;
        fStack_b0 = auVar5._8_4_;
        fStack_ac = auVar5._12_4_;
        auVar34._0_4_ = local_b8 * *pfVar19 + fVar32;
        auVar34._4_4_ = fStack_b4 * pfVar19[1] + fVar32;
        auVar34._8_4_ = fStack_b0 * pfVar19[2] + fVar32;
        auVar34._12_4_ = fStack_ac * pfVar19[3] + fVar32;
        auVar34._16_4_ = local_b8 * pfVar19[4] + fVar32;
        auVar34._20_4_ = fStack_b4 * pfVar19[5] + fVar32;
        auVar34._24_4_ = fStack_b0 * pfVar19[6] + fVar32;
        auVar34._28_4_ = fStack_ac + fVar32;
        auVar36._8_4_ = 0x800000;
        auVar36._0_8_ = 0x80000000800000;
        auVar36._12_4_ = 0x800000;
        auVar36._16_4_ = 0x800000;
        auVar36._20_4_ = 0x800000;
        auVar36._24_4_ = 0x800000;
        auVar36._28_4_ = 0x800000;
        auVar3 = vmaxps_avx(auVar34,auVar36);
        auVar51 = vpsrld_avx(auVar3._16_16_,0x17);
        auVar37._8_4_ = 0x807fffff;
        auVar37._0_8_ = 0x807fffff807fffff;
        auVar37._12_4_ = 0x807fffff;
        auVar37._16_4_ = 0x807fffff;
        auVar37._20_4_ = 0x807fffff;
        auVar37._24_4_ = 0x807fffff;
        auVar37._28_4_ = 0x807fffff;
        auVar2 = vandps_avx(auVar3,auVar37);
        auVar56._8_4_ = 0x3f000000;
        auVar56._0_8_ = 0x3f0000003f000000;
        auVar56._12_4_ = 0x3f000000;
        auVar56._16_4_ = 0x3f000000;
        auVar56._20_4_ = 0x3f000000;
        auVar56._24_4_ = 0x3f000000;
        auVar56._28_4_ = 0x3f000000;
        auVar4 = vorps_avx(auVar56,auVar2);
        auVar53._8_4_ = 0x3f3504f3;
        auVar53._0_8_ = 0x3f3504f33f3504f3;
        auVar53._12_4_ = 0x3f3504f3;
        auVar53._16_4_ = 0x3f3504f3;
        auVar53._20_4_ = 0x3f3504f3;
        auVar53._24_4_ = 0x3f3504f3;
        auVar53._28_4_ = 0x3f3504f3;
        auVar33 = vcmpps_avx(auVar53,auVar4,2);
        auVar2 = vandnps_avx(auVar33,auVar4);
        fVar35 = auVar4._0_4_ + -1.0 + auVar2._0_4_;
        fVar43 = auVar4._4_4_ + -1.0 + auVar2._4_4_;
        fVar44 = auVar4._8_4_ + -1.0 + auVar2._8_4_;
        fVar45 = auVar4._12_4_ + -1.0 + auVar2._12_4_;
        fVar46 = auVar4._16_4_ + -1.0 + auVar2._16_4_;
        fVar47 = auVar4._20_4_ + -1.0 + auVar2._20_4_;
        fVar48 = auVar4._24_4_ + -1.0 + auVar2._24_4_;
        auVar51 = vpsubd_avx(auVar51,auVar33._16_16_);
        auVar49 = vpsrld_avx(auVar3._0_16_,0x17);
        auVar54._8_4_ = 0xffffff81;
        auVar54._0_8_ = 0xffffff81ffffff81;
        auVar54._12_4_ = 0xffffff81;
        auVar51 = vpaddd_avx(auVar51,auVar54);
        auVar49 = vpsubd_avx(auVar49,auVar33._0_16_);
        auVar49 = vpaddd_avx(auVar49,auVar54);
        auVar50._16_16_ = auVar51;
        auVar50._0_16_ = auVar49;
        auVar33 = vcmpps_avx(auVar34,_DAT_002d8800,2);
        auVar3 = vcvtdq2ps_avx(auVar50);
        auVar38._0_4_ =
             auVar3._0_4_ * 0.6931472 + fVar35 +
             fVar35 * fVar35 *
             (((((((((fVar35 * 0.070376836 + -0.1151461) * fVar35 + 0.116769984) * fVar35 +
                   -0.12420141) * fVar35 + 0.14249323) * fVar35 + -0.16668057) * fVar35 + 0.20000714
                ) * fVar35 + -0.24999994) * fVar35 + 0.3333333) * fVar35 + -0.5);
        auVar38._4_4_ =
             auVar3._4_4_ * 0.6931472 + fVar43 +
             fVar43 * fVar43 *
             (((((((((fVar43 * 0.070376836 + -0.1151461) * fVar43 + 0.116769984) * fVar43 +
                   -0.12420141) * fVar43 + 0.14249323) * fVar43 + -0.16668057) * fVar43 + 0.20000714
                ) * fVar43 + -0.24999994) * fVar43 + 0.3333333) * fVar43 + -0.5);
        auVar38._8_4_ =
             auVar3._8_4_ * 0.6931472 + fVar44 +
             fVar44 * fVar44 *
             (((((((((fVar44 * 0.070376836 + -0.1151461) * fVar44 + 0.116769984) * fVar44 +
                   -0.12420141) * fVar44 + 0.14249323) * fVar44 + -0.16668057) * fVar44 + 0.20000714
                ) * fVar44 + -0.24999994) * fVar44 + 0.3333333) * fVar44 + -0.5);
        auVar38._12_4_ =
             auVar3._12_4_ * 0.6931472 + fVar45 +
             fVar45 * fVar45 *
             (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 + 0.116769984) * fVar45 +
                   -0.12420141) * fVar45 + 0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714
                ) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 + -0.5);
        auVar38._16_4_ =
             auVar3._16_4_ * 0.6931472 + fVar46 +
             fVar46 * fVar46 *
             (((((((((fVar46 * 0.070376836 + -0.1151461) * fVar46 + 0.116769984) * fVar46 +
                   -0.12420141) * fVar46 + 0.14249323) * fVar46 + -0.16668057) * fVar46 + 0.20000714
                ) * fVar46 + -0.24999994) * fVar46 + 0.3333333) * fVar46 + -0.5);
        auVar38._20_4_ =
             auVar3._20_4_ * 0.6931472 + fVar47 +
             fVar47 * fVar47 *
             (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) * fVar47 +
                   -0.12420141) * fVar47 + 0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 + -0.5);
        auVar38._24_4_ =
             auVar3._24_4_ * 0.6931472 + fVar48 +
             fVar48 * fVar48 *
             (((((((((fVar48 * 0.070376836 + -0.1151461) * fVar48 + 0.116769984) * fVar48 +
                   -0.12420141) * fVar48 + 0.14249323) * fVar48 + -0.16668057) * fVar48 + 0.20000714
                ) * fVar48 + -0.24999994) * fVar48 + 0.3333333) * fVar48 + -0.5);
        auVar38._28_4_ = auVar3._28_4_ + auVar4._28_4_ + -1.0 + auVar2._28_4_ + 0.0;
        auVar2 = vorps_avx(auVar33,auVar38);
        fVar35 = (float)uVar25;
        fVar43 = (float)(uVar25 >> 0x20);
        auVar3._4_4_ = auVar2._4_4_ * fVar43;
        auVar3._0_4_ = auVar2._0_4_ * fVar35;
        auVar3._8_4_ = auVar2._8_4_ * -fVar1;
        auVar3._12_4_ = auVar2._12_4_ * -fVar1;
        auVar3._16_4_ = auVar2._16_4_ * fVar35;
        auVar3._20_4_ = auVar2._20_4_ * fVar43;
        auVar3._24_4_ = auVar2._24_4_ * -fVar1;
        auVar3._28_4_ = auVar2._28_4_;
        auVar39._8_4_ = 0x42b0c0a5;
        auVar39._0_8_ = 0x42b0c0a542b0c0a5;
        auVar39._12_4_ = 0x42b0c0a5;
        auVar39._16_4_ = 0x42b0c0a5;
        auVar39._20_4_ = 0x42b0c0a5;
        auVar39._24_4_ = 0x42b0c0a5;
        auVar39._28_4_ = 0x42b0c0a5;
        auVar2 = vminps_avx(auVar3,auVar39);
        auVar40._8_4_ = 0xc2b0c0a5;
        auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar40._12_4_ = 0xc2b0c0a5;
        auVar40._16_4_ = 0xc2b0c0a5;
        auVar40._20_4_ = 0xc2b0c0a5;
        auVar40._24_4_ = 0xc2b0c0a5;
        auVar40._28_4_ = 0xc2b0c0a5;
        auVar33 = vmaxps_avx(auVar2,auVar40);
        auVar41._0_4_ = auVar33._0_4_ * 1.442695 + 0.5;
        auVar41._4_4_ = auVar33._4_4_ * 1.442695 + 0.5;
        auVar41._8_4_ = auVar33._8_4_ * 1.442695 + 0.5;
        auVar41._12_4_ = auVar33._12_4_ * 1.442695 + 0.5;
        auVar41._16_4_ = auVar33._16_4_ * 1.442695 + 0.5;
        auVar41._20_4_ = auVar33._20_4_ * 1.442695 + 0.5;
        auVar41._24_4_ = auVar33._24_4_ * 1.442695 + 0.5;
        auVar41._28_4_ = 0x3ff8aa3b;
        auVar3 = vroundps_avx(auVar41,1);
        auVar2 = vcmpps_avx(auVar41,auVar3,1);
        auVar55._8_4_ = 0x3f800000;
        auVar55._0_8_ = 0x3f8000003f800000;
        auVar55._12_4_ = 0x3f800000;
        auVar55._16_4_ = 0x3f800000;
        auVar55._20_4_ = 0x3f800000;
        auVar55._24_4_ = 0x3f800000;
        auVar55._28_4_ = 0x3f800000;
        auVar2 = vandps_avx(auVar2,auVar55);
        auVar2 = vsubps_avx(auVar3,auVar2);
        auVar4._4_4_ = auVar2._4_4_ * 0.6931472;
        auVar4._0_4_ = auVar2._0_4_ * 0.6931472;
        auVar4._8_4_ = auVar2._8_4_ * 0.6931472;
        auVar4._12_4_ = auVar2._12_4_ * 0.6931472;
        auVar4._16_4_ = auVar2._16_4_ * 0.6931472;
        auVar4._20_4_ = auVar2._20_4_ * 0.6931472;
        auVar4._24_4_ = auVar2._24_4_ * 0.6931472;
        auVar4._28_4_ = auVar3._28_4_;
        auVar33 = vsubps_avx(auVar33,auVar4);
        fVar35 = auVar33._0_4_;
        fVar43 = auVar33._4_4_;
        fVar44 = auVar33._8_4_;
        fVar45 = auVar33._12_4_;
        fVar46 = auVar33._16_4_;
        fVar47 = auVar33._20_4_;
        fVar48 = auVar33._24_4_;
        auVar51._0_4_ = (int)auVar2._0_4_;
        auVar51._4_4_ = (int)auVar2._4_4_;
        auVar51._8_4_ = (int)auVar2._8_4_;
        auVar51._12_4_ = (int)auVar2._12_4_;
        auVar42._16_4_ = (int)auVar2._16_4_;
        auVar42._0_16_ = auVar51;
        auVar42._20_4_ = (int)auVar2._20_4_;
        auVar42._24_4_ = (int)auVar2._24_4_;
        auVar42._28_4_ = (int)auVar2._28_4_;
        auVar49 = vpslld_avx(auVar51,0x17);
        auVar51 = vpslld_avx(auVar42._16_16_,0x17);
        auVar52._8_4_ = 0x3f800000;
        auVar52._0_8_ = 0x3f8000003f800000;
        auVar52._12_4_ = 0x3f800000;
        auVar51 = vpaddd_avx(auVar51,auVar52);
        auVar49 = vpaddd_avx(auVar49,auVar52);
        auVar6._4_4_ = auVar49._4_4_ * *(float *)(*pauVar15 + 4) *
                       (fVar43 + 1.0 +
                       fVar43 * fVar43 *
                       (((((fVar43 * 0.00019875691 + 0.0013981999) * fVar43 + 0.008333452) * fVar43
                         + 0.041665796) * fVar43 + 0.16666666) * fVar43 + 0.5));
        auVar6._0_4_ = auVar49._0_4_ * *(float *)*pauVar15 *
                       (fVar35 + 1.0 +
                       fVar35 * fVar35 *
                       (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35
                         + 0.041665796) * fVar35 + 0.16666666) * fVar35 + 0.5));
        auVar6._8_4_ = auVar49._8_4_ * *(float *)(*pauVar15 + 8) *
                       (fVar44 + 1.0 +
                       fVar44 * fVar44 *
                       (((((fVar44 * 0.00019875691 + 0.0013981999) * fVar44 + 0.008333452) * fVar44
                         + 0.041665796) * fVar44 + 0.16666666) * fVar44 + 0.5));
        auVar6._12_4_ =
             auVar49._12_4_ * *(float *)(*pauVar15 + 0xc) *
             (fVar45 + 1.0 +
             fVar45 * fVar45 *
             (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
               0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5));
        auVar6._16_4_ =
             auVar51._0_4_ * *(float *)(*pauVar15 + 0x10) *
             (fVar46 + 1.0 +
             fVar46 * fVar46 *
             (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
               0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5));
        auVar6._20_4_ =
             auVar51._4_4_ * *(float *)(*pauVar15 + 0x14) *
             (fVar47 + 1.0 +
             fVar47 * fVar47 *
             (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
               0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5));
        auVar6._24_4_ =
             auVar51._8_4_ * *(float *)(*pauVar15 + 0x18) *
             (fVar48 + 1.0 +
             fVar48 * fVar48 *
             (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
               0.041665796) * fVar48 + 0.16666666) * fVar48 + 0.5));
        auVar6._28_4_ = auVar33._28_4_ + 1.0 + auVar3._28_4_;
        *pauVar15 = auVar6;
        pfVar19 = pfVar19 + 8;
        pauVar15 = pauVar15 + 1;
        lVar13 = lVar13 + 8;
      }
      for (; (int)lVar13 < iVar23; lVar13 = lVar13 + 1) {
        p_Var20 = pp_Var14[-3];
        fVar32 = powf(fVar31 * *(float *)(uVar11 + lVar13 * 4) +
                      *(float *)(&this->field_0xe0 + (long)p_Var20),
                      -*(float *)(&this->field_0xdc + (long)p_Var20));
        *(float *)(uVar10 + lVar13 * 4) = fVar32 * *(float *)(uVar10 + lVar13 * 4);
      }
    }
  }
  else {
    iVar23 = 0;
    if (*(int *)(&this->field_0xd0 + (long)pp_Var14[-3]) != 1) goto LAB_001d3fd8;
    piVar7 = (int *)CONCAT44(square_blob.refcount._4_4_,(int)square_blob.refcount);
    square_sum.data = square_blob.data;
    square_sum.refcount._0_4_ = (int)square_blob.refcount;
    square_sum.refcount._4_4_ = square_blob.refcount._4_4_;
    square_sum.elemsize._0_4_ = (undefined4)square_blob.elemsize;
    square_sum.elemsize._4_4_ = (undefined4)(square_blob.elemsize >> 0x20);
    square_sum.elempack = square_blob.elempack;
    square_sum.allocator = square_blob.allocator;
    square_sum.dims = square_blob.dims;
    square_sum.w = square_blob.w;
    square_sum.h = square_blob.h;
    square_sum.d = square_blob.d;
    square_sum.c = square_blob.c;
    square_sum.cstep = square_blob.cstep;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
      pp_Var14 = this->_vptr_LRN_x86_avx;
    }
    p_Var20 = pp_Var14[-3];
    uVar22 = *(uint *)(&this->field_0xd4 + (long)p_Var20);
    uVar28 = _w;
    if (1 < (int)uVar22) {
      uVar22 = uVar22 >> 1;
      opt_b.lightmode = opt->lightmode;
      opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
      opt_b.num_threads = opt->num_threads;
      opt_b.workspace_allocator = opt->workspace_allocator;
      opt_b.openmp_blocktime = opt->openmp_blocktime;
      opt_b.use_winograd_convolution = opt->use_winograd_convolution;
      opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
      opt_b.use_int8_inference = opt->use_int8_inference;
      opt_b.use_vulkan_compute = opt->use_vulkan_compute;
      opt_b.use_bf16_storage = opt->use_bf16_storage;
      opt_b.use_fp16_packed = opt->use_fp16_packed;
      opt_b.use_fp16_storage = opt->use_fp16_storage;
      opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
      opt_b.use_int8_packed = opt->use_int8_packed;
      opt_b.use_int8_storage = opt->use_int8_storage;
      opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
      opt_b.use_packing_layout = opt->use_packing_layout;
      opt_b.use_shader_pack8 = opt->use_shader_pack8;
      opt_b.use_subgroup_basic = opt->use_subgroup_basic;
      opt_b.use_subgroup_vote = opt->use_subgroup_vote;
      opt_b.use_subgroup_ballot = opt->use_subgroup_ballot;
      opt_b.use_subgroup_shuffle = opt->use_subgroup_shuffle;
      opt_b.use_image_storage = opt->use_image_storage;
      opt_b.use_tensor_storage = opt->use_tensor_storage;
      opt_b.use_weight_fp16_storage = opt->use_weight_fp16_storage;
      opt_b.flush_denormals = opt->flush_denormals;
      opt_b.use_local_pool_allocator = opt->use_local_pool_allocator;
      opt_b.use_reserved_1 = opt->use_reserved_1;
      opt_b.use_reserved_2 = opt->use_reserved_2;
      opt_b.use_reserved_3 = opt->use_reserved_3;
      opt_b.use_reserved_4 = opt->use_reserved_4;
      opt_b.use_reserved_5 = opt->use_reserved_5;
      opt_b.use_reserved_6 = opt->use_reserved_6;
      opt_b.use_reserved_7 = opt->use_reserved_7;
      opt_b.use_reserved_8 = opt->use_reserved_8;
      opt_b.use_reserved_9 = opt->use_reserved_9;
      opt_b.use_reserved_10 = opt->use_reserved_10;
      opt_b.use_reserved_11 = opt->use_reserved_11;
      opt_b.blob_allocator = opt->workspace_allocator;
      iVar18 = ~uVar22 + *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
      copy_make_border(&square_blob,&square_sum,uVar22,iVar18,uVar22,iVar18,0,0.0,&opt_b);
      if ((square_sum.data == (void *)0x0) || ((long)square_sum.c * square_sum.cstep == 0))
      goto LAB_001d3fcb;
      p_Var20 = this->_vptr_LRN_x86_avx[-3];
      uVar22 = *(uint *)(&this->field_0xd4 + (long)p_Var20);
      uVar28 = square_sum.w;
    }
    uVar22 = uVar22 * uVar22;
    fVar31 = *(float *)(&this->field_0xd8 + (long)p_Var20);
    std::vector<int,_std::allocator<int>_>::vector
              (&_space_ofs,(ulong)uVar22,(allocator_type *)&opt_b);
    pp_Var14 = this->_vptr_LRN_x86_avx;
    iVar18 = *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
    iVar17 = uVar28 - iVar18;
    lVar13 = 0;
    iVar23 = 0;
    for (iVar27 = 0; iVar27 < iVar18; iVar27 = iVar27 + 1) {
      for (lVar24 = 0; iVar30 = (int)lVar24, iVar30 < iVar18; lVar24 = lVar24 + 1) {
        _space_ofs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[(int)lVar13 + lVar24] = iVar23 + iVar30;
        iVar18 = *(int *)(&this->field_0xd4 + (long)pp_Var14[-3]);
      }
      iVar23 = iVar23 + iVar17 + iVar30;
      lVar13 = (int)lVar13 + lVar24;
    }
    uVar16 = 0;
    uVar25 = (ulong)_w;
    if ((int)_w < 1) {
      uVar25 = uVar16;
    }
    uVar26 = (ulong)_h;
    if ((int)_h < 1) {
      uVar26 = uVar16;
    }
    while( true ) {
      iVar18 = (int)uVar16;
      if (iVar18 == iVar12) break;
      Mat::channel((Mat *)&opt_b,bottom_top_blob,iVar18);
      lVar13 = opt_b._0_8_;
      Mat::~Mat((Mat *)&opt_b);
      Mat::channel((Mat *)&opt_b,&square_sum,iVar18);
      for (uVar16 = 0; uVar16 != uVar26; uVar16 = uVar16 + 1) {
        lVar24 = (long)(int)opt_b._44_4_ * uVar16 * (long)opt_b.workspace_allocator + opt_b._0_8_;
        pp_Var14 = this->_vptr_LRN_x86_avx;
        for (uVar29 = 0; uVar29 != uVar25; uVar29 = uVar29 + 1) {
          fVar32 = 0.0;
          for (uVar21 = 0; uVar22 != uVar21; uVar21 = uVar21 + 1) {
            fVar32 = fVar32 + *(float *)(lVar24 + uVar29 * 4 +
                                        (long)_space_ofs.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start[uVar21] * 4);
          }
          fVar32 = powf(fVar32 * fVar31 * (1.0 / (float)(int)uVar22) +
                        *(float *)(&this->field_0xe0 + (long)pp_Var14[-3]),
                        -*(float *)(&this->field_0xdc + (long)pp_Var14[-3]));
          *(float *)(lVar13 + uVar29 * 4) = fVar32 * *(float *)(lVar13 + uVar29 * 4);
        }
        lVar13 = lVar13 + (long)(int)_w * 4;
      }
      Mat::~Mat((Mat *)&opt_b);
      uVar16 = (ulong)(iVar18 + 1);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&_space_ofs.super__Vector_base<int,_std::allocator<int>_>);
  }
  Mat::~Mat(&square_sum);
  iVar23 = 0;
LAB_001d3fd8:
  Mat::~Mat(&square_blob);
  return iVar23;
}

Assistant:

int LRN_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * pow(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * pow(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}